

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O1

Point2f __thiscall pbrt::SobolSampler::Get2D(SobolSampler *this)

{
  undefined1 auVar1 [16];
  float fVar2;
  undefined8 uVar3;
  Tuple2<pbrt::Point2,_float> TVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  bool bVar7;
  Point2f u;
  Float local_40 [4];
  
  if (0x3fe < this->dimension) {
    this->dimension = 2;
  }
  local_40[3] = sampleDimension(this,this->dimension);
  local_40[1] = sampleDimension(this,this->dimension + 1);
  local_40[0] = local_40[3];
  if (this->dimension == 0) {
    iVar6 = 1;
    do {
      bVar7 = iVar6 != 1;
      local_40[bVar7] = (float)this->resolution * local_40[bVar7];
      if ((Get2D()::reg == '\0') && (iVar5 = __cxa_guard_acquire(&Get2D()::reg), iVar5 != 0)) {
        StatRegisterer::StatRegisterer
                  ((StatRegisterer *)&Get2D()::reg,
                   Get2D()::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                   (PixelAccumFunc)0x0);
        __cxa_guard_release(&Get2D()::reg);
      }
      *(long *)(in_FS_OFFSET + -0x3c0) = *(long *)(in_FS_OFFSET + -0x3c0) + 1;
      if (local_40[bVar7] < (float)(&(this->pixel).super_Tuple2<pbrt::Point2,_int>.x)[iVar6 != 1]) {
        *(long *)(in_FS_OFFSET + -0x3c8) = *(long *)(in_FS_OFFSET + -0x3c8) + 1;
      }
      if ((Get2D()::reg == '\0') && (iVar5 = __cxa_guard_acquire(&Get2D()::reg), iVar5 != 0)) {
        StatRegisterer::StatRegisterer
                  ((StatRegisterer *)&Get2D()::reg,
                   Get2D()::{lambda(pbrt::StatsAccumulator&)#2}::StatsAccumulator__,
                   (PixelAccumFunc)0x0);
        __cxa_guard_release(&Get2D()::reg);
      }
      *(long *)(in_FS_OFFSET + -0x3b0) = *(long *)(in_FS_OFFSET + -0x3b0) + 1;
      fVar2 = local_40[bVar7] -
              (float)(&(this->pixel).super_Tuple2<pbrt::Point2,_int>.x)[iVar6 != 1];
      if (1.0 < fVar2) {
        *(long *)(in_FS_OFFSET + -0x3b8) = *(long *)(in_FS_OFFSET + -0x3b8) + 1;
      }
      auVar1 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)fVar2));
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar2),ZEXT816(0) << 0x40,1);
      local_40[bVar7] = (Float)((uint)!(bool)((byte)uVar3 & 1) * auVar1._0_4_);
      iVar6 = iVar6 + -1;
    } while (iVar6 == 0);
  }
  this->dimension = this->dimension + 2;
  TVar4.y = local_40[1];
  TVar4.x = local_40[0];
  return (Point2f)TVar4;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        if (dimension + 1 >= NSobolDimensions)
            dimension = 2;

        Point2f u(sampleDimension(dimension), sampleDimension(dimension + 1));
        if (dimension == 0) {
            // Remap Sobol$'$ dimensions used for pixel samples
            for (int dim = 0; dim < 2; ++dim) {
                u[dim] = u[dim] * resolution;
                CHECK_RARE(1e-7, u[dim] - pixel[dim] < 0);
                CHECK_RARE(1e-7, u[dim] - pixel[dim] > 1);
                u[dim] = Clamp(u[dim] - pixel[dim], (Float)0, OneMinusEpsilon);
            }
        }
        dimension += 2;
        return u;
    }